

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall spirv_cross::Compiler::update_active_builtins(Compiler *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  SPIRFunction *func;
  SPIRVariable *pSVar6;
  long lVar7;
  LoopLock loop_lock;
  ActiveBuiltinHandler handler;
  LoopLock LStack_48;
  ActiveBuiltinHandler local_40;
  
  (this->active_input_builtins).lower = 0;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->active_input_builtins).higher._M_h);
  (this->active_output_builtins).lower = 0;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->active_output_builtins).higher._M_h);
  this->clip_distance_count = 0;
  this->cull_distance_count = 0;
  local_40.super_OpcodeHandler._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_003a4338;
  local_40.compiler = this;
  func = Variant::get<spirv_cross::SPIRFunction>
                   ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                    (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_40.super_OpcodeHandler);
  ParsedIR::create_loop_hard_lock(&this->ir);
  sVar2 = (this->ir).ids_for_type[2].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->ir).ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar7 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar7);
      pVVar4 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        if (pSVar6->storage == StorageClassOutput) {
          bVar5 = interface_variable_exists_in_entry_point(this,(pSVar6->super_IVariant).self.id);
          if (bVar5 && (pSVar6->initializer).id != 0) {
            ActiveBuiltinHandler::add_if_builtin(&local_40,(pSVar6->super_IVariant).self.id,true);
          }
        }
      }
      lVar7 = lVar7 + 4;
    } while (sVar2 << 2 != lVar7);
  }
  ParsedIR::LoopLock::~LoopLock(&LStack_48);
  return;
}

Assistant:

void Compiler::update_active_builtins()
{
	active_input_builtins.reset();
	active_output_builtins.reset();
	cull_distance_count = 0;
	clip_distance_count = 0;
	ActiveBuiltinHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (var.storage != StorageClassOutput)
			return;
		if (!interface_variable_exists_in_entry_point(var.self))
			return;

		// Also, make sure we preserve output variables which are only initialized, but never accessed by any code.
		if (var.initializer != ID(0))
			handler.add_if_builtin_or_block(var.self);
	});
}